

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# staleblock_test.cc
# Opt level: O1

void snapshot_after_block_reuse_test(void)

{
  undefined1 auVar1 [16];
  fdb_status s;
  fdb_status fVar2;
  sb_decision_t sVar3;
  int iVar4;
  fdb_status fVar5;
  size_t sVar6;
  char *pcVar7;
  size_t sVar8;
  size_t sVar9;
  fdb_kvs_handle *pfVar10;
  fdb_kvs_handle *pfVar11;
  fdb_kvs_handle *pfVar12;
  char *pcVar13;
  fdb_config *pfVar14;
  fdb_config *pfVar15;
  char *pcVar16;
  fdb_doc **doc;
  uint uVar17;
  uint uVar18;
  size_t unaff_RBP;
  ulong uVar19;
  size_t sVar20;
  fdb_kvs_handle *pfVar21;
  uint uVar22;
  fdb_kvs_handle *unaff_R12;
  ulong unaff_R13;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 handle;
  char *unaff_R14;
  char *pcVar23;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aVar24;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aVar25;
  char *unaff_R15;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *snap_db;
  fdb_kvs_config kvs_config;
  char keybuf [16];
  timeval __test_begin;
  fdb_file_info file_info;
  fdb_config fconfig;
  fdb_kvs_handle *pfStackY_24e0;
  fdb_file_handle *pfStackY_24d8;
  fdb_kvs_config fStackY_24d0;
  char acStackY_24b8 [264];
  fdb_config fStackY_23b0;
  char acStackY_22b8 [520];
  fdb_doc **ppfStackY_20b0;
  size_t sStackY_20a0;
  char *pcStackY_2098;
  char *pcStackY_2090;
  code *pcStackY_2088;
  fdb_kvs_handle *pfStack_2078;
  fdb_file_handle *pfStack_2070;
  fdb_iterator *pfStack_2068;
  fdb_doc *pfStack_2060;
  fdb_kvs_handle *pfStack_2058;
  timeval tStack_2050;
  char acStack_2040 [512];
  fdb_kvs_config fStack_1e40;
  fdb_file_info fStack_1e28;
  char acStack_1de0 [256];
  fdb_config fStack_1ce0;
  char *pcStack_1be8;
  fdb_kvs_handle *pfStack_1be0;
  fdb_kvs_handle *pfStack_1bd8;
  fdb_kvs_handle *pfStack_1bd0;
  fdb_kvs_handle *pfStack_1bc8;
  fdb_kvs_handle *pfStack_1bc0;
  fdb_kvs_handle *pfStack_1bb0;
  fdb_file_handle *pfStack_1ba8;
  uint uStack_1b9c;
  fdb_kvs_info fStack_1b98;
  timeval tStack_1b68;
  fdb_kvs_config fStack_1b58;
  undefined1 auStack_1b40 [80];
  docio_handle *pdStack_1af0;
  btreeblk_handle *pbStack_1ae8;
  btree_blk_ops *pbStack_1ae0;
  filemgr_ops *pfStack_1ad8;
  fdb_config fStack_1ad0;
  undefined1 uStack_18f9;
  fdb_kvs_handle fStack_18f8;
  fdb_kvs_handle *pfStack_16f0;
  char *pcStack_16e8;
  char *pcStack_16e0;
  fdb_kvs_handle *pfStack_16d8;
  fdb_kvs_handle *pfStack_16d0;
  fdb_file_handle *pfStack_16c8;
  timeval tStack_16c0;
  undefined1 auStack_16b0 [536];
  undefined1 auStack_1498 [375];
  undefined1 uStack_1321;
  fdb_kvs_handle *pfStack_1298;
  undefined8 uStack_1280;
  fdb_kvs_handle *pfStack_1258;
  fdb_kvs_handle *pfStack_1250;
  fdb_kvs_handle *pfStack_1248;
  fdb_kvs_handle *pfStack_1240;
  fdb_kvs_handle *pfStack_1238;
  code *pcStack_1230;
  fdb_kvs_handle *pfStack_1228;
  fdb_file_handle *pfStack_1220;
  fdb_kvs_handle *pfStack_1218;
  fdb_kvs_handle *pfStack_1210;
  fdb_kvs_config fStack_1208;
  timeval tStack_11f0;
  fdb_file_info fStack_11e0;
  fdb_kvs_info fStack_1198;
  undefined1 auStack_1168 [512];
  fdb_kvs_handle fStack_f68;
  size_t sStack_d60;
  char *pcStack_d58;
  char *pcStack_d50;
  code *pcStack_d48;
  fdb_kvs_handle *pfStack_d40;
  fdb_file_handle *pfStack_d38;
  fdb_kvs_info fStack_d30;
  timeval tStack_d00;
  fdb_kvs_config fStack_cf0;
  fdb_file_info fStack_cd8;
  char acStack_c90 [256];
  char acStack_b90 [511];
  undefined1 uStack_991;
  fdb_config fStack_790;
  char *pcStack_698;
  fdb_config *pfStack_690;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_688;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_680;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_678;
  code *pcStack_670;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_668;
  fdb_file_handle *pfStack_660;
  size_t sStack_658;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_650;
  kvs_info *pkStack_648;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_640;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_638;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_630;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_628;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_620;
  timeval tStack_618;
  undefined1 auStack_608 [24];
  fdb_file_info fStack_5f0;
  fdb_config fStack_5a8;
  fdb_config fStack_4a8;
  fdb_config *pfStack_3b0;
  fdb_kvs_handle *pfStack_3a8;
  ulong uStack_3a0;
  char *pcStack_398;
  fdb_file_info *pfStack_390;
  code *pcStack_388;
  fdb_kvs_handle *pfStack_380;
  fdb_file_handle *pfStack_378;
  fdb_kvs_handle *pfStack_370;
  fdb_config *pfStack_368;
  size_t sStack_360;
  fdb_kvs_config fStack_358;
  timeval tStack_340;
  fdb_file_info fStack_330;
  fdb_config fStack_2e8;
  fdb_config *pfStack_1f0;
  char *pcStack_1e0;
  fdb_file_info *pfStack_1d8;
  code *pcStack_1d0;
  fdb_kvs_handle *local_1c8;
  fdb_file_handle *local_1c0;
  fdb_kvs_handle *local_1b8;
  fdb_kvs_config local_1b0;
  char local_198 [24];
  timeval local_180;
  fdb_file_info local_170;
  fdb_config local_128;
  
  pcStack_1d0 = (code *)0x10c430;
  memleak_start();
  pcStack_1d0 = (code *)0x10c43c;
  gettimeofday(&local_180,(__timezone_ptr_t)0x0);
  pcVar13 = (char *)&local_128;
  pcStack_1d0 = (code *)0x10c44c;
  fdb_get_default_config();
  pcStack_1d0 = (code *)0x10c456;
  fdb_get_default_kvs_config();
  pcStack_1d0 = (code *)0x10c462;
  system("rm -rf  staleblktest* > errorlog.txt");
  local_128.compaction_threshold = '\0';
  local_128.num_keeping_headers = 5;
  pcStack_1d0 = (code *)0x10c485;
  fVar2 = fdb_open(&local_1c0,"./staleblktest1",(fdb_config *)pcVar13);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c6bc;
  pcStack_1d0 = (code *)0x10c4a6;
  fVar2 = fdb_kvs_open(local_1c0,&local_1c8,"num_keep",&local_1b0);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c6c3;
  unaff_R13 = 0;
  pcVar13 = "key";
  unaff_R14 = "val";
  unaff_R15 = (char *)&local_170;
  do {
    pcStack_1d0 = (code *)0x10c4de;
    fVar2 = fdb_set_kv(local_1c8,"key",4,"val",4);
    if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0010c6a7:
      pcStack_1d0 = (code *)0x10c6ae;
      snapshot_after_block_reuse_test();
      goto LAB_0010c6ae;
    }
    pcStack_1d0 = (code *)0x10c4f3;
    fVar2 = fdb_get_file_info(local_1c0,(fdb_file_info *)unaff_R15);
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pcStack_1d0 = (code *)0x10c6a7;
      snapshot_after_block_reuse_test();
      goto LAB_0010c6a7;
    }
    unaff_R13 = unaff_R13 - 1;
  } while (local_170.file_size < 0x1000001);
  pcStack_1d0 = (code *)0x10c51b;
  fVar2 = fdb_commit(local_1c0,'\x01');
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c6ca;
  pcVar13 = "key%d";
  unaff_R14 = local_198;
  unaff_R15 = "reu";
  unaff_RBP = 0;
  do {
    pcStack_1d0 = (code *)0x10c547;
    sprintf(unaff_R14,"key%d",unaff_RBP);
    unaff_R12 = local_1c8;
    pcStack_1d0 = (code *)0x10c553;
    sVar6 = strlen(unaff_R14);
    pcStack_1d0 = (code *)0x10c56a;
    fVar2 = fdb_set_kv(unaff_R12,unaff_R14,sVar6,"reu",4);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c6b5;
    pcStack_1d0 = (code *)0x10c581;
    fVar2 = fdb_commit(local_1c0,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c6ae;
    uVar17 = (int)unaff_RBP + 1;
    unaff_RBP = (size_t)uVar17;
  } while (uVar17 != 10);
  pcVar13 = "key";
  unaff_R14 = "val";
  unaff_RBP = unaff_R13 & 0xffffffff;
  do {
    uVar17 = (int)unaff_RBP + 1;
    unaff_RBP = (size_t)uVar17;
    if (uVar17 == 0) goto LAB_0010c5ca;
    pcStack_1d0 = (code *)0x10c5bf;
    fVar2 = fdb_set_kv(local_1c8,"key",4,"val",4);
  } while (fVar2 == FDB_RESULT_SUCCESS);
  pcStack_1d0 = (code *)0x10c5ca;
  snapshot_after_block_reuse_test();
LAB_0010c5ca:
  pcStack_1d0 = (code *)0x10c5d9;
  fVar2 = fdb_commit(local_1c0,'\x01');
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c6d1;
  pcStack_1d0 = (code *)0x10c5f7;
  fVar2 = fdb_snapshot_open(local_1c8,&local_1b8,6 - unaff_R13);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c6d8;
  pcStack_1d0 = (code *)0x10c609;
  fVar2 = fdb_kvs_close(local_1b8);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c6df;
  pcStack_1d0 = (code *)0x10c627;
  fVar2 = fdb_snapshot_open(local_1c8,&local_1b8,5 - unaff_R13);
  if (fVar2 != FDB_RESULT_NO_DB_INSTANCE) goto LAB_0010c6e6;
  pcStack_1d0 = (code *)0x10c639;
  fVar2 = fdb_kvs_close(local_1c8);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c6eb;
  pcStack_1d0 = (code *)0x10c64b;
  fVar2 = fdb_close(local_1c0);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcStack_1d0 = (code *)0x10c658;
    fdb_shutdown();
    pcStack_1d0 = (code *)0x10c65d;
    memleak_end();
    pcVar13 = "%s PASSED\n";
    if (snapshot_after_block_reuse_test()::__test_pass != '\0') {
      pcVar13 = "%s FAILED\n";
    }
    pcStack_1d0 = (code *)0x10c68e;
    fprintf(_stderr,pcVar13,"snapshot after block reuse test");
    return;
  }
  goto LAB_0010c6f2;
LAB_0010c6ae:
  pcStack_1d0 = (code *)0x10c6b5;
  snapshot_after_block_reuse_test();
LAB_0010c6b5:
  pcStack_1d0 = (code *)0x10c6bc;
  snapshot_after_block_reuse_test();
LAB_0010c6bc:
  pcStack_1d0 = (code *)0x10c6c3;
  snapshot_after_block_reuse_test();
LAB_0010c6c3:
  pcStack_1d0 = (code *)0x10c6ca;
  snapshot_after_block_reuse_test();
LAB_0010c6ca:
  pcStack_1d0 = (code *)0x10c6d1;
  snapshot_after_block_reuse_test();
LAB_0010c6d1:
  pcStack_1d0 = (code *)0x10c6d8;
  snapshot_after_block_reuse_test();
LAB_0010c6d8:
  pcStack_1d0 = (code *)0x10c6df;
  snapshot_after_block_reuse_test();
LAB_0010c6df:
  pcStack_1d0 = (code *)0x10c6e6;
  snapshot_after_block_reuse_test();
LAB_0010c6e6:
  pcStack_1d0 = (code *)0x10c6eb;
  snapshot_after_block_reuse_test();
LAB_0010c6eb:
  pcStack_1d0 = (code *)0x10c6f2;
  snapshot_after_block_reuse_test();
LAB_0010c6f2:
  pcStack_1d0 = snapshot_inmem_before_block_reuse_test;
  snapshot_after_block_reuse_test();
  pcStack_388 = (code *)0x10c70d;
  pfStack_1f0 = (fdb_config *)pcVar13;
  pcStack_1e0 = unaff_R14;
  pfStack_1d8 = (fdb_file_info *)unaff_R15;
  pcStack_1d0 = (code *)unaff_RBP;
  memleak_start();
  pcStack_388 = (code *)0x10c719;
  gettimeofday(&tStack_340,(__timezone_ptr_t)0x0);
  pfVar14 = &fStack_2e8;
  pcStack_388 = (code *)0x10c729;
  fdb_get_default_config();
  pcStack_388 = (code *)0x10c733;
  fdb_get_default_kvs_config();
  pcStack_388 = (code *)0x10c73f;
  system("rm -rf  staleblktest* > errorlog.txt");
  fStack_2e8.num_keeping_headers = 1;
  pcStack_388 = (code *)0x10c75e;
  fVar2 = fdb_open(&pfStack_378,"./staleblktest1",pfVar14);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcStack_388 = (code *)0x10c778;
    fVar2 = fdb_kvs_open_default(pfStack_378,&pfStack_380,&fStack_358);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ca2a;
    pcStack_388 = (code *)0x10c7a2;
    fVar2 = fdb_set_kv(pfStack_380,"key",4,"snp",4);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ca31;
    pcStack_388 = (code *)0x10c7b9;
    fVar2 = fdb_commit(pfStack_378,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ca38;
    pcStack_388 = (code *)0x10c7d6;
    fVar2 = fdb_snapshot_open(pfStack_380,&pfStack_370,0xffffffffffffffff);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ca3f;
    unaff_RBP = 0;
    unaff_R15 = (char *)&fStack_330;
    do {
      pcStack_388 = (code *)0x10c80d;
      fVar2 = fdb_set_kv(pfStack_380,"key",4,"val",4);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ca0e;
      pcStack_388 = (code *)0x10c822;
      fVar2 = fdb_get_file_info(pfStack_378,(fdb_file_info *)unaff_R15);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ca07;
      uVar17 = (int)unaff_RBP + 1;
      unaff_RBP = (size_t)uVar17;
    } while (fStack_330.file_size < 0x1000001);
    unaff_R15 = (char *)0x0;
    pfVar14 = (fdb_config *)0x148599;
    unaff_R14 = "val";
    do {
      unaff_R12 = (fdb_kvs_handle *)(ulong)uVar17;
      do {
        pcStack_388 = (code *)0x10c865;
        fVar2 = fdb_set_kv(pfStack_380,"key",4,"val",4);
        if (fVar2 != FDB_RESULT_SUCCESS) {
          pcStack_388 = (code *)0x10ca07;
          snapshot_inmem_before_block_reuse_test();
          goto LAB_0010ca07;
        }
        uVar22 = (int)unaff_R12 - 1;
        unaff_R12 = (fdb_kvs_handle *)(ulong)uVar22;
      } while (uVar22 != 0);
      pcStack_388 = (code *)0x10c881;
      fVar2 = fdb_commit(pfStack_378,'\x01');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ca15;
      uVar22 = (int)unaff_R15 + 1;
      unaff_R15 = (char *)(ulong)uVar22;
    } while (uVar22 != 5);
    pcStack_388 = (code *)0x10c89b;
    sVar3 = sb_check_block_reusing(pfStack_380);
    if (sVar3 != SBD_RECLAIM) goto LAB_0010ca46;
    pcStack_388 = (code *)0x10c8c4;
    fVar2 = fdb_get_kv(pfStack_370,"key",4,&pfStack_368,&sStack_360);
    pfVar15 = pfStack_368;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ca4b;
    pcStack_388 = (code *)0x10c8e5;
    iVar4 = bcmp(pfStack_368,"snp",sStack_360);
    if (iVar4 != 0) goto LAB_0010ca52;
    pcStack_388 = (code *)0x10c8f7;
    fVar2 = fdb_kvs_close(pfStack_370);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ca5a;
    pfVar15 = (fdb_config *)0x148599;
    unaff_R14 = "val";
    do {
      pcStack_388 = (code *)0x10c927;
      fVar2 = fdb_set_kv(pfStack_380,"key",4,"val",4);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ca1c;
      uVar17 = (int)unaff_RBP - 1;
      unaff_RBP = (size_t)uVar17;
    } while (uVar17 != 0);
    pcStack_388 = (code *)0x10c942;
    fVar2 = fdb_commit(pfStack_378,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ca61;
    pcStack_388 = (code *)0x10c95d;
    fVar2 = fdb_snapshot_open(pfStack_380,&pfStack_370,1);
    if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0010c977:
      if (fVar2 != FDB_RESULT_NO_DB_INSTANCE) goto LAB_0010ca68;
      pcStack_388 = (code *)0x10c98a;
      fVar2 = fdb_free_block(pfStack_368);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ca6d;
      pcStack_388 = (code *)0x10c99b;
      fVar2 = fdb_kvs_close(pfStack_380);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ca74;
      pcStack_388 = (code *)0x10c9ad;
      fVar2 = fdb_close(pfStack_378);
      if (fVar2 == FDB_RESULT_SUCCESS) {
        pcStack_388 = (code *)0x10c9ba;
        fdb_shutdown();
        pcStack_388 = (code *)0x10c9bf;
        memleak_end();
        pcVar13 = "%s PASSED\n";
        if (snapshot_inmem_before_block_reuse_test()::__test_pass != '\0') {
          pcVar13 = "%s FAILED\n";
        }
        pcStack_388 = (code *)0x10c9f0;
        fprintf(_stderr,pcVar13,"snapshot inmem before block reuse test");
        return;
      }
      goto LAB_0010ca7b;
    }
    pcStack_388 = (code *)0x10c96b;
    fVar5 = fdb_kvs_close(pfStack_370);
    fVar2 = FDB_RESULT_SUCCESS;
    if (fVar5 == FDB_RESULT_SUCCESS) goto LAB_0010c977;
  }
  else {
LAB_0010ca23:
    pcStack_388 = (code *)0x10ca2a;
    snapshot_inmem_before_block_reuse_test();
LAB_0010ca2a:
    pcStack_388 = (code *)0x10ca31;
    snapshot_inmem_before_block_reuse_test();
LAB_0010ca31:
    pcStack_388 = (code *)0x10ca38;
    snapshot_inmem_before_block_reuse_test();
LAB_0010ca38:
    pcStack_388 = (code *)0x10ca3f;
    snapshot_inmem_before_block_reuse_test();
LAB_0010ca3f:
    pcStack_388 = (code *)0x10ca46;
    snapshot_inmem_before_block_reuse_test();
LAB_0010ca46:
    pcStack_388 = (code *)0x10ca4b;
    snapshot_inmem_before_block_reuse_test();
LAB_0010ca4b:
    pfVar15 = pfVar14;
    pcStack_388 = (code *)0x10ca52;
    snapshot_inmem_before_block_reuse_test();
LAB_0010ca52:
    pcStack_388 = (code *)0x10ca5a;
    snapshot_inmem_before_block_reuse_test();
LAB_0010ca5a:
    pcStack_388 = (code *)0x10ca61;
    snapshot_inmem_before_block_reuse_test();
LAB_0010ca61:
    pcStack_388 = (code *)0x10ca68;
    snapshot_inmem_before_block_reuse_test();
LAB_0010ca68:
    pcStack_388 = (code *)0x10ca6d;
    snapshot_inmem_before_block_reuse_test();
LAB_0010ca6d:
    pcStack_388 = (code *)0x10ca74;
    snapshot_inmem_before_block_reuse_test();
LAB_0010ca74:
    pcStack_388 = (code *)0x10ca7b;
    snapshot_inmem_before_block_reuse_test();
LAB_0010ca7b:
    pcStack_388 = (code *)0x10ca82;
    snapshot_inmem_before_block_reuse_test();
  }
  pcStack_388 = variable_value_size_test;
  snapshot_inmem_before_block_reuse_test();
  aVar24.seqtree = (btree *)0x0;
  pcStack_670 = (code *)0x10caa7;
  pfStack_3b0 = pfVar15;
  pfStack_3a8 = unaff_R12;
  uStack_3a0 = unaff_R13;
  pcStack_398 = unaff_R14;
  pfStack_390 = (fdb_file_info *)unaff_R15;
  pcStack_388 = (code *)unaff_RBP;
  gettimeofday(&tStack_618,(__timezone_ptr_t)0x0);
  pcStack_670 = (code *)0x10caac;
  memleak_start();
  pcStack_670 = (code *)0x10cab6;
  pcVar7 = (char *)operator_new__(0x500000);
  pcVar13 = auStack_608;
  pcStack_670 = (code *)0x10cac6;
  fdb_get_default_kvs_config();
  pfVar14 = &fStack_4a8;
  pcStack_670 = (code *)0x10cad6;
  fdb_get_default_config();
  fStack_4a8.compaction_threshold = '\0';
  fStack_4a8.block_reusing_threshold = 0x41;
  pcStack_670 = (code *)0x10caf4;
  system("rm -rf  staleblktest* > errorlog.txt");
  handle.seqtree = (btree *)&pfStack_660;
  pcStack_670 = (code *)0x10cb0b;
  fdb_open((fdb_file_handle **)handle.seqtree,"./staleblktest1",pfVar14);
  pcStack_670 = (code *)0x10cb1a;
  fdb_kvs_open_default(pfStack_660,(fdb_kvs_handle **)&aStack_668.seqtree,(fdb_kvs_config *)pcVar13)
  ;
  if (fStack_4a8.num_keeping_headers != 0xffffffffffffffff) {
    pcVar23 = "%d_key";
    pcVar13 = (char *)&fStack_5a8;
    aVar24.seqtree = (btree *)0x0;
    iVar4 = 0;
    do {
      sStack_658 = CONCAT44(sStack_658._4_4_,iVar4 + 3);
      pfVar14 = (fdb_config *)0x1ff;
      aStack_650 = aVar24;
      do {
        pcStack_670 = (code *)0x10cb60;
        sprintf(pcVar13,"%d_key",(ulong)((int)pfVar14 + 1));
        pcStack_670 = (code *)0x10cb70;
        memset(pcVar7,0x61,(size_t)pfVar14);
        handle = aStack_668;
        pcVar7[(long)pfVar14] = '\0';
        pcStack_670 = (code *)0x10cb81;
        sVar6 = strlen(pcVar13);
        unaff_RBP = sVar6 + 1;
        pcStack_670 = (code *)0x10cb8d;
        sVar6 = strlen(pcVar7);
        pcStack_670 = (code *)0x10cba2;
        fVar2 = fdb_set_kv((fdb_kvs_handle *)handle.seqtree,pcVar13,unaff_RBP,pcVar7,sVar6 + 1);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d083;
        pfVar14 = (fdb_config *)&pfVar14[2].wal_threshold;
      } while (pfVar14 != (fdb_config *)0x7ff);
      pcStack_670 = (code *)0x10cbc9;
      fVar2 = fdb_commit(pfStack_660,'\x01');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d091;
      aVar24.seqtree = (btree *)&(aStack_650.seqtree)->vsize;
      iVar4 = (int)sStack_658;
    } while (aVar24.seqtree < (undefined1 *)(fStack_4a8.num_keeping_headers + 1));
    aVar24 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)(long)(int)sStack_658;
  }
  pcStack_670 = (code *)0x10cc05;
  fVar2 = fdb_snapshot_open((fdb_kvs_handle *)aStack_668.seqtree,
                            (fdb_kvs_handle **)&aStack_630.seqtree,(fdb_seqnum_t)aVar24);
  sVar20 = unaff_RBP;
  if (fVar2 == FDB_RESULT_SUCCESS) {
    sVar8 = 0xffffffff;
    pcVar13 = "%d_key";
    pfVar14 = &fStack_5a8;
    handle.seqtree = (btree *)0x0;
LAB_0010cc24:
    unaff_RBP = 0x3ff;
    sStack_658 = sVar8;
    aStack_650 = handle;
LAB_0010cc33:
    pcStack_670 = (code *)0x10cc43;
    sprintf((char *)pfVar14,"%d_key",(ulong)((int)unaff_RBP + 1));
    pcStack_670 = (code *)0x10cc53;
    memset(pcVar7,0x62,unaff_RBP);
    handle = aStack_668;
    pcVar7[unaff_RBP] = '\0';
    pcStack_670 = (code *)0x10cc63;
    sVar6 = strlen((char *)pfVar14);
    pcVar23 = (char *)(sVar6 + 1);
    pcStack_670 = (code *)0x10cc6f;
    sVar6 = strlen(pcVar7);
    pcStack_670 = (code *)0x10cc84;
    fVar2 = fdb_set_kv((fdb_kvs_handle *)handle.seqtree,pfVar14,(size_t)pcVar23,pcVar7,sVar6 + 1);
    if (fVar2 == FDB_RESULT_SUCCESS) goto code_r0x0010cc8c;
    pcStack_670 = (code *)0x10d083;
    variable_value_size_test();
LAB_0010d083:
    pcStack_670 = (code *)0x10d08a;
    variable_value_size_test();
    goto LAB_0010d08a;
  }
LAB_0010d0a6:
  pcStack_670 = (code *)0x10d0ad;
  variable_value_size_test();
LAB_0010d0ad:
  pcStack_670 = (code *)0x10d0b2;
  variable_value_size_test();
LAB_0010d0b2:
  pcStack_670 = (code *)0x10d0b9;
  variable_value_size_test();
LAB_0010d0b9:
  pcStack_670 = (code *)0x10d0c0;
  variable_value_size_test();
LAB_0010d0c0:
  pcStack_670 = (code *)0x10d0c7;
  variable_value_size_test();
LAB_0010d0c7:
  pcStack_670 = (code *)0x10d0ce;
  variable_value_size_test();
LAB_0010d0ce:
  pcStack_670 = (code *)0x10d0d5;
  variable_value_size_test();
LAB_0010d0d5:
  aVar25 = aVar24;
  pcStack_670 = (code *)0x10d0dc;
  variable_value_size_test();
LAB_0010d0dc:
  pcStack_670 = (code *)0x10d0e4;
  variable_value_size_test();
LAB_0010d0e4:
  pcStack_670 = (code *)0x10d0eb;
  variable_value_size_test();
LAB_0010d0eb:
  pcStack_670 = (code *)0x10d0f2;
  variable_value_size_test();
LAB_0010d0f2:
  pcStack_670 = (code *)0x10d0fa;
  variable_value_size_test();
LAB_0010d0fa:
  pcStack_670 = (code *)0x10d101;
  variable_value_size_test();
LAB_0010d101:
  pcStack_670 = (code *)0x10d108;
  variable_value_size_test();
LAB_0010d108:
  pcStack_670 = (code *)0x10d10f;
  variable_value_size_test();
LAB_0010d10f:
  pcStack_670 = (code *)0x10d116;
  variable_value_size_test();
LAB_0010d116:
  pcStack_670 = rollback_with_num_keeping_headers;
  variable_value_size_test();
  pcStack_d48 = (code *)0x10d13a;
  pcStack_698 = pcVar7;
  pfStack_690 = pfVar14;
  aStack_688 = handle;
  aStack_680 = aVar25;
  aStack_678 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar13;
  pcStack_670 = (code *)sVar20;
  gettimeofday(&tStack_d00,(__timezone_ptr_t)0x0);
  pcStack_d48 = (code *)0x10d13f;
  memleak_start();
  pcStack_d48 = (code *)0x10d14c;
  fdb_get_default_kvs_config();
  pcStack_d48 = (code *)0x10d15c;
  fdb_get_default_config();
  fStack_790.compaction_threshold = '\0';
  fStack_790.block_reusing_threshold = 0x41;
  fStack_790.num_keeping_headers = 1;
  pcStack_d48 = (code *)0x10d183;
  system("rm -rf  staleblktest* > errorlog.txt");
  pcStack_d48 = (code *)0x10d19a;
  fdb_open(&pfStack_d38,"./staleblktest1",&fStack_790);
  pcStack_d48 = (code *)0x10d1a8;
  fdb_kvs_open_default(pfStack_d38,&pfStack_d40,&fStack_cf0);
  pcVar16 = "%dkey";
  pcVar7 = acStack_c90;
  pcVar23 = acStack_b90;
  pcVar13 = (char *)0x0;
  do {
    pcStack_d48 = (code *)0x10d1d0;
    sprintf(pcVar7,"%dkey",pcVar13);
    pcStack_d48 = (code *)0x10d1e2;
    memset(pcVar23,0x62,0x1ff);
    pfVar21 = pfStack_d40;
    uStack_991 = 0;
    pcStack_d48 = (code *)0x10d1f6;
    sVar9 = strlen(pcVar7);
    pcStack_d48 = (code *)0x10d201;
    sVar6 = strlen(pcVar23);
    pcStack_d48 = (code *)0x10d215;
    fVar2 = fdb_set_kv(pfVar21,pcVar7,sVar9,pcVar23,sVar6);
    if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0010d465:
      pcStack_d48 = (code *)0x10d46c;
      rollback_with_num_keeping_headers();
      goto LAB_0010d46c;
    }
    pcStack_d48 = (code *)0x10d22c;
    fVar2 = fdb_commit(pfStack_d38,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pcStack_d48 = (code *)0x10d465;
      rollback_with_num_keeping_headers();
      goto LAB_0010d465;
    }
    uVar17 = (int)pcVar13 + 1;
    pcVar13 = (char *)(ulong)uVar17;
  } while (uVar17 != 10);
  pcVar23 = (char *)0x0;
  pcVar13 = acStack_c90;
  pcVar7 = acStack_b90;
  pcVar16 = (char *)0x0;
  do {
    pfVar21 = pfStack_d40;
    builtin_strncpy(acStack_c90,"0key",5);
    builtin_strncpy(acStack_b90,
                    "ccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccc"
                    ,0x80);
    pcStack_d48 = (code *)0x10d2be;
    sVar9 = strlen(pcVar13);
    pcStack_d48 = (code *)0x10d2c9;
    sVar6 = strlen(pcVar7);
    pcStack_d48 = (code *)0x10d2dd;
    fVar2 = fdb_set_kv(pfVar21,pcVar13,sVar9,pcVar7,sVar6);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d473;
    pcStack_d48 = (code *)0x10d2f4;
    fVar2 = fdb_get_file_info(pfStack_d38,&fStack_cd8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d46c;
    uVar17 = (int)pcVar16 + 1;
    pcVar16 = (char *)(ulong)uVar17;
  } while (fStack_cd8.file_size < 0x1000000);
  pcStack_d48 = (code *)0x10d319;
  sVar3 = sb_check_block_reusing(pfStack_d40);
  if (sVar3 == SBD_RECLAIM) {
    pcStack_d48 = (code *)0x10d331;
    fVar2 = fdb_commit(pfStack_d38,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d486;
    pcVar7 = acStack_c90;
    pcVar23 = acStack_b90;
    pcVar13 = (char *)0x0;
    do {
      pcStack_d48 = (code *)0x10d35e;
      sprintf(pcVar7,"%dkey",pcVar13);
      pcStack_d48 = (code *)0x10d370;
      memset(pcVar23,100,0x1ff);
      pfVar21 = pfStack_d40;
      uStack_991 = 0;
      pcStack_d48 = (code *)0x10d384;
      sVar9 = strlen(pcVar7);
      pcStack_d48 = (code *)0x10d38f;
      sVar6 = strlen(pcVar23);
      pcStack_d48 = (code *)0x10d3a3;
      fVar2 = fdb_set_kv(pfVar21,pcVar7,sVar9,pcVar23,sVar6);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d47a;
      uVar22 = (int)pcVar13 + 1;
      pcVar13 = (char *)(ulong)uVar22;
    } while (uVar17 != uVar22);
    pcStack_d48 = (code *)0x10d3be;
    fVar2 = fdb_rollback(&pfStack_d40,10);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d48d;
    pcStack_d48 = (code *)0x10d3d4;
    fVar2 = fdb_get_kvs_info(pfStack_d40,&fStack_d30);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d494;
    if (fStack_d30.doc_count != 10) {
      pcStack_d48 = (code *)0x10d3ee;
      rollback_with_num_keeping_headers();
    }
    pcStack_d48 = (code *)0x10d3f7;
    fVar2 = fdb_kvs_close(pfStack_d40);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d49b;
    pcStack_d48 = (code *)0x10d409;
    fVar2 = fdb_close(pfStack_d38);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pcStack_d48 = (code *)0x10d416;
      fdb_shutdown();
      pcStack_d48 = (code *)0x10d41b;
      memleak_end();
      pcVar13 = "%s PASSED\n";
      if (rollback_with_num_keeping_headers()::__test_pass != '\0') {
        pcVar13 = "%s FAILED\n";
      }
      pcStack_d48 = (code *)0x10d44c;
      fprintf(_stderr,pcVar13,"rollback with num keeping headers");
      return;
    }
  }
  else {
LAB_0010d481:
    pcStack_d48 = (code *)0x10d486;
    rollback_with_num_keeping_headers();
LAB_0010d486:
    pcStack_d48 = (code *)0x10d48d;
    rollback_with_num_keeping_headers();
LAB_0010d48d:
    pcStack_d48 = (code *)0x10d494;
    rollback_with_num_keeping_headers();
LAB_0010d494:
    pcStack_d48 = (code *)0x10d49b;
    rollback_with_num_keeping_headers();
LAB_0010d49b:
    pcStack_d48 = (code *)0x10d4a2;
    rollback_with_num_keeping_headers();
  }
  pcStack_d48 = crash_and_recover_with_num_keeping_test;
  rollback_with_num_keeping_headers();
  pcStack_1230 = (code *)0x10d4c6;
  fStack_f68.bub_ctx.space_used = (uint64_t)pcVar16;
  sStack_d60 = sVar9;
  pcStack_d58 = pcVar7;
  pcStack_d50 = pcVar23;
  pcStack_d48 = (code *)pcVar13;
  gettimeofday(&tStack_11f0,(__timezone_ptr_t)0x0);
  pcStack_1230 = (code *)0x10d4cb;
  memleak_start();
  pcStack_1230 = (code *)0x10d4d8;
  fdb_get_default_kvs_config();
  pcStack_1230 = (code *)0x10d4e8;
  fdb_get_default_config();
  fStack_f68.config.block_reusing_threshold._7_1_ = 0;
  fStack_f68.max_seqnum = 0x41;
  fStack_f68.handle_busy.super___atomic_base<unsigned_char>._M_i = (__atomic_base<unsigned_char>)0xa
  ;
  fStack_f68.dirty_updates = '\0';
  fStack_f68._466_6_ = 0;
  pcStack_1230 = (code *)0x10d50f;
  system("rm -rf  staleblktest* > errorlog.txt");
  pcStack_1230 = (code *)0x10d526;
  fdb_open(&pfStack_1220,"./staleblktest1file.1",(fdb_config *)&fStack_f68.config.encryption_key);
  pcStack_1230 = (code *)0x10d53b;
  fdb_kvs_open(pfStack_1220,&pfStack_1228,"./staleblktest1",&fStack_1208);
  pcVar7 = "%dkey";
  pfVar21 = &fStack_f68;
  pfVar12 = (fdb_kvs_handle *)auStack_1168;
  pcVar13 = (char *)0x0;
  do {
    pcStack_1230 = (code *)0x10d563;
    sprintf((char *)pfVar21,"%dkey",pcVar13);
    pcStack_1230 = (code *)0x10d575;
    memset(pfVar12,0x62,0x1ff);
    pfVar11 = pfStack_1228;
    auStack_1168[0x1ff] = 0;
    pcStack_1230 = (code *)0x10d589;
    pfVar10 = (fdb_kvs_handle *)strlen((char *)pfVar21);
    pcStack_1230 = (code *)0x10d594;
    sVar6 = strlen((char *)pfVar12);
    pcStack_1230 = (code *)0x10d5a8;
    fVar2 = fdb_set_kv(pfVar11,pfVar21,(size_t)pfVar10,pfVar12,sVar6);
    if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0010da08:
      pcStack_1230 = (code *)0x10da0f;
      crash_and_recover_with_num_keeping_test();
      goto LAB_0010da0f;
    }
    pcStack_1230 = (code *)0x10d5bf;
    fVar2 = fdb_commit(pfStack_1220,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pcStack_1230 = (code *)0x10da08;
      crash_and_recover_with_num_keeping_test();
      goto LAB_0010da08;
    }
    uVar17 = (int)pcVar13 + 1;
    pcVar13 = (char *)(ulong)uVar17;
  } while (uVar17 != 0xb);
  pfVar12 = (fdb_kvs_handle *)0x0;
  pcVar7 = (char *)&fStack_f68;
  pcVar13 = auStack_1168;
  pfVar21 = (fdb_kvs_handle *)0x0;
  do {
    pfVar11 = pfStack_1228;
    fStack_f68.kvs_config._4_1_ = 0;
    fStack_f68.kvs_config.create_if_missing = true;
    fStack_f68.kvs_config._1_3_ = 0x79656b;
    auStack_1168._0_8_ = 0x6363636363636363;
    auStack_1168._8_8_ = (fdb_custom_cmp_variable)0x6363636363636363;
    auStack_1168._16_8_ = (void *)0x6363636363636363;
    auStack_1168._24_8_ = (kvs_info *)0x6363636363636363;
    auStack_1168._32_8_ = (kvs_ops_stat *)0x6363636363636363;
    auStack_1168._40_7_ = 0x63636363636363;
    auStack_1168[0x2f] = 99;
    auStack_1168._48_7_ = 0x63636363636363;
    auStack_1168[0x37] = 99;
    auStack_1168._56_7_ = 0x63636363636363;
    auStack_1168[0x3f] = 99;
    auStack_1168._64_8_ = (btree *)0x6363636363636363;
    auStack_1168._72_8_ = (filemgr *)0x6363636363636363;
    auStack_1168._80_8_ = (docio_handle *)0x6363636363636363;
    auStack_1168._88_8_ = (btreeblk_handle *)0x6363636363636363;
    auStack_1168._96_8_ = (btree_blk_ops *)0x6363636363636363;
    auStack_1168._104_7_ = 0x63636363636363;
    auStack_1168[0x6f] = 99;
    auStack_1168._112_7_ = 0x63636363636363;
    auStack_1168._119_8_ = 0x6363636363636363;
    auStack_1168[0x7f] = 0;
    pcStack_1230 = (code *)0x10d652;
    pfVar10 = (fdb_kvs_handle *)strlen(pcVar7);
    pcStack_1230 = (code *)0x10d65d;
    sVar6 = strlen(pcVar13);
    pcStack_1230 = (code *)0x10d671;
    fVar2 = fdb_set_kv(pfVar11,pcVar7,(size_t)pfVar10,pcVar13,sVar6);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da16;
    pcStack_1230 = (code *)0x10d688;
    fVar2 = fdb_get_file_info(pfStack_1220,&fStack_11e0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da0f;
    pfVar21 = (fdb_kvs_handle *)(ulong)((int)pfVar21 + 1);
  } while (fStack_11e0.file_size < 0x1000000);
  pcStack_1230 = (code *)0x10d6ab;
  sVar3 = sb_check_block_reusing(pfStack_1228);
  if (sVar3 == SBD_RECLAIM) {
    pcStack_1230 = (code *)0x10d6c3;
    fVar2 = fdb_commit(pfStack_1220,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da45;
    pcStack_1230 = (code *)0x10d6dc;
    fVar2 = fdb_get_kvs_info(pfStack_1228,&fStack_1198);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da4c;
    pfStack_1218 = (fdb_kvs_handle *)fStack_1198.last_seqnum;
    pfVar12 = &fStack_f68;
    pfVar11 = (fdb_kvs_handle *)auStack_1168;
    pcVar13 = (char *)0x0;
    do {
      pcStack_1230 = (code *)0x10d716;
      sprintf((char *)pfVar12,"%dkey",pcVar13);
      pfVar10 = pfStack_1228;
      auStack_1168._0_8_ = 0x6464646464646464;
      auStack_1168._8_8_ = (fdb_custom_cmp_variable)0x6464646464646464;
      auStack_1168._16_8_ = (void *)0x6464646464646464;
      auStack_1168._24_8_ = (kvs_info *)0x6464646464646464;
      auStack_1168._32_8_ = (kvs_ops_stat *)0x6464646464646464;
      auStack_1168._40_7_ = 0x64646464646464;
      auStack_1168[0x2f] = 100;
      auStack_1168._48_7_ = 0x64646464646464;
      auStack_1168[0x37] = 100;
      auStack_1168._56_7_ = 0x64646464646464;
      auStack_1168[0x3f] = 0;
      pcStack_1230 = (code *)0x10d751;
      pcVar7 = (char *)strlen((char *)pfVar12);
      pcStack_1230 = (code *)0x10d75c;
      sVar6 = strlen((char *)pfVar11);
      pcStack_1230 = (code *)0x10d770;
      fVar2 = fdb_set_kv(pfVar10,pfVar12,(size_t)pcVar7,pfVar11,sVar6);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da24;
      pcStack_1230 = (code *)0x10d787;
      fVar2 = fdb_commit(pfStack_1220,'\x01');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da1d;
      uVar17 = (int)pcVar13 + 1;
      pcVar13 = (char *)(ulong)uVar17;
    } while (uVar17 != 10);
    pcStack_1230 = (code *)0x10d7a3;
    fVar2 = fdb_kvs_close(pfStack_1228);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da53;
    pcStack_1230 = (code *)0x10d7b5;
    fVar2 = fdb_close(pfStack_1220);
    pcVar7 = (char *)pfStack_1218;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da5a;
    pcStack_1230 = (code *)0x10d7c7;
    fdb_shutdown();
    pcStack_1230 = (code *)0x10d7e0;
    fVar2 = fdb_open(&pfStack_1220,"./staleblktest1file.1",
                     (fdb_config *)&fStack_f68.config.encryption_key);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da61;
    pcStack_1230 = (code *)0x10d801;
    fdb_kvs_open(pfStack_1220,&pfStack_1228,"./staleblktest1",&fStack_1208);
    pcStack_1230 = (code *)0x10d810;
    fVar2 = fdb_get_file_info(pfStack_1220,&fStack_11e0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da68;
    pcStack_1230 = (code *)0x10d838;
    iVar4 = _disk_dump("./staleblktest1file.1",fStack_11e0.file_size,
                       (ulong)(((uint)fStack_f68.config.encryption_key.bytes._0_4_ >> 2) +
                              fStack_f68.config.encryption_key.bytes._0_4_ * 2));
    if (iVar4 < 0) goto LAB_0010da6f;
    pcStack_1230 = (code *)0x10d851;
    fVar2 = fdb_snapshot_open(pfStack_1228,&pfStack_1210,(fdb_seqnum_t)pcVar7);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da74;
    pcStack_1230 = (code *)0x10d864;
    fVar2 = fdb_rollback(&pfStack_1228,(fdb_seqnum_t)pcVar7);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da7b;
    pcStack_1230 = (code *)0x10d87d;
    fVar2 = fdb_compact(pfStack_1220,"./staleblktest1file.3");
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da82;
    pcVar7 = "%dkey";
    pfVar11 = &fStack_f68;
    pcVar13 = (char *)0x0;
    do {
      pcStack_1230 = (code *)0x10d8a5;
      sprintf((char *)pfVar11,"%dkey",pcVar13);
      pfVar12 = pfStack_1228;
      pcStack_1230 = (code *)0x10d8b1;
      sVar6 = strlen((char *)pfVar11);
      pcStack_1230 = (code *)0x10d8bf;
      fVar2 = fdb_del_kv(pfVar12,pfVar11,sVar6);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da32;
      pcStack_1230 = (code *)0x10d8d6;
      fVar2 = fdb_commit(pfStack_1220,'\x01');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da2b;
      uVar17 = (int)pcVar13 + 1;
      pcVar13 = (char *)(ulong)uVar17;
    } while (uVar17 != 0xb);
    pcStack_1230 = (code *)0x10d8ee;
    sVar3 = sb_check_block_reusing(pfStack_1228);
    if (sVar3 != SBD_NONE) goto LAB_0010da89;
    pcVar13 = (char *)0x0;
    pcVar7 = auStack_1168;
    pfVar10 = &fStack_f68;
    do {
      fStack_f68.kvs_config._4_1_ = 0;
      fStack_f68.kvs_config.create_if_missing = true;
      fStack_f68.kvs_config._1_3_ = 0x79656b;
      pcStack_1230 = (code *)0x10d92d;
      memset(pcVar7,0x65,0x1ff);
      pfVar12 = pfStack_1228;
      auStack_1168[0x1ff] = 0;
      pcStack_1230 = (code *)0x10d941;
      pfVar11 = (fdb_kvs_handle *)strlen((char *)pfVar10);
      pcStack_1230 = (code *)0x10d94c;
      sVar6 = strlen(pcVar7);
      pcStack_1230 = (code *)0x10d960;
      fVar2 = fdb_set_kv(pfVar12,pfVar10,(size_t)pfVar11,pcVar7,sVar6);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da39;
      uVar17 = (int)pfVar21 - 1;
      pfVar21 = (fdb_kvs_handle *)(ulong)uVar17;
    } while (uVar17 != 0);
    pcStack_1230 = (code *)0x10d976;
    sVar3 = sb_check_block_reusing(pfStack_1228);
    if (sVar3 != SBD_RECLAIM) goto LAB_0010da8e;
    pcStack_1230 = (code *)0x10d989;
    fVar2 = fdb_kvs_close(pfStack_1210);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da93;
    pcStack_1230 = (code *)0x10d99a;
    fVar2 = fdb_kvs_close(pfStack_1228);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da9a;
    pcStack_1230 = (code *)0x10d9ac;
    fVar2 = fdb_close(pfStack_1220);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pcStack_1230 = (code *)0x10d9b9;
      fdb_shutdown();
      pcStack_1230 = (code *)0x10d9be;
      memleak_end();
      pcVar13 = "%s PASSED\n";
      if (crash_and_recover_with_num_keeping_test()::__test_pass != '\0') {
        pcVar13 = "%s FAILED\n";
      }
      pcStack_1230 = (code *)0x10d9ef;
      fprintf(_stderr,pcVar13,"crash and recover with num keeping test");
      return;
    }
  }
  else {
LAB_0010da40:
    pcStack_1230 = (code *)0x10da45;
    crash_and_recover_with_num_keeping_test();
LAB_0010da45:
    pcStack_1230 = (code *)0x10da4c;
    crash_and_recover_with_num_keeping_test();
LAB_0010da4c:
    pcStack_1230 = (code *)0x10da53;
    crash_and_recover_with_num_keeping_test();
LAB_0010da53:
    pcStack_1230 = (code *)0x10da5a;
    crash_and_recover_with_num_keeping_test();
LAB_0010da5a:
    pcStack_1230 = (code *)0x10da61;
    crash_and_recover_with_num_keeping_test();
LAB_0010da61:
    pcStack_1230 = (code *)0x10da68;
    crash_and_recover_with_num_keeping_test();
LAB_0010da68:
    pcStack_1230 = (code *)0x10da6f;
    crash_and_recover_with_num_keeping_test();
LAB_0010da6f:
    pcStack_1230 = (code *)0x10da74;
    crash_and_recover_with_num_keeping_test();
LAB_0010da74:
    pcStack_1230 = (code *)0x10da7b;
    crash_and_recover_with_num_keeping_test();
LAB_0010da7b:
    pcStack_1230 = (code *)0x10da82;
    crash_and_recover_with_num_keeping_test();
LAB_0010da82:
    pcStack_1230 = (code *)0x10da89;
    crash_and_recover_with_num_keeping_test();
LAB_0010da89:
    pcStack_1230 = (code *)0x10da8e;
    crash_and_recover_with_num_keeping_test();
LAB_0010da8e:
    pcStack_1230 = (code *)0x10da93;
    crash_and_recover_with_num_keeping_test();
LAB_0010da93:
    pcStack_1230 = (code *)0x10da9a;
    crash_and_recover_with_num_keeping_test();
LAB_0010da9a:
    pcStack_1230 = (code *)0x10daa1;
    crash_and_recover_with_num_keeping_test();
  }
  pcStack_1230 = reuse_on_delete_test;
  crash_and_recover_with_num_keeping_test();
  pfStack_16d8 = (fdb_kvs_handle *)0x10dac5;
  pfStack_1258 = (fdb_kvs_handle *)pcVar7;
  pfStack_1250 = pfVar11;
  pfStack_1248 = pfVar10;
  pfStack_1240 = pfVar21;
  pfStack_1238 = pfVar12;
  pcStack_1230 = (code *)pcVar13;
  gettimeofday(&tStack_16c0,(__timezone_ptr_t)0x0);
  pfStack_16d8 = (fdb_kvs_handle *)0x10daca;
  memleak_start();
  pfStack_16d8 = (fdb_kvs_handle *)0x10dada;
  fdb_get_default_kvs_config();
  pfStack_16d8 = (fdb_kvs_handle *)0x10daea;
  fdb_get_default_config();
  uStack_1321 = 0;
  pfStack_1298 = (fdb_kvs_handle *)0x41;
  uStack_1280 = 10;
  pfStack_16d8 = (fdb_kvs_handle *)0x10db11;
  system("rm -rf  staleblktest* > errorlog.txt");
  pfStack_16d8 = (fdb_kvs_handle *)0x10db28;
  fdb_open(&pfStack_16c8,"./staleblktest1",(fdb_config *)(auStack_1498 + 0x148));
  pfStack_16d8 = (fdb_kvs_handle *)0x10db36;
  fdb_kvs_open_default(pfStack_16c8,&pfStack_16d0,(fdb_kvs_config *)(auStack_16b0 + 0x200));
  pcVar23 = "%dkey";
  pcVar7 = auStack_1498 + 0x48;
  pcVar13 = auStack_16b0;
  pfVar21 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_16d8 = (fdb_kvs_handle *)0x10db5b;
    sprintf(pcVar7,"%dkey",pfVar21);
    pfStack_16d8 = (fdb_kvs_handle *)0x10db6d;
    memset(pcVar13,0x62,0x1ff);
    pfVar12 = pfStack_16d0;
    auStack_16b0[0x1ff] = 0;
    pfStack_16d8 = (fdb_kvs_handle *)0x10db81;
    pfVar11 = (fdb_kvs_handle *)strlen(pcVar7);
    pfStack_16d8 = (fdb_kvs_handle *)0x10db8c;
    sVar6 = strlen(pcVar13);
    pfStack_16d8 = (fdb_kvs_handle *)0x10dba0;
    fVar2 = fdb_set_kv(pfVar12,pcVar7,(size_t)pfVar11,pcVar13,sVar6);
    if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0010de39:
      pfStack_16d8 = (fdb_kvs_handle *)0x10de40;
      reuse_on_delete_test();
      goto LAB_0010de40;
    }
    pfStack_16d8 = (fdb_kvs_handle *)0x10dbb7;
    fVar2 = fdb_commit(pfStack_16c8,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pfStack_16d8 = (fdb_kvs_handle *)0x10de39;
      reuse_on_delete_test();
      goto LAB_0010de39;
    }
    uVar17 = (int)pfVar21 + 1;
    pfVar21 = (fdb_kvs_handle *)(ulong)uVar17;
  } while (uVar17 != 0xb);
  pcVar13 = auStack_1498 + 0x48;
  pfVar12 = (fdb_kvs_handle *)auStack_16b0;
  pfVar11 = (fdb_kvs_handle *)auStack_1498;
  pcVar23 = (char *)(fdb_kvs_handle *)0x0;
  do {
    pfVar10 = (fdb_kvs_handle *)pcVar23;
    pfStack_16d8 = (fdb_kvs_handle *)0x10dbf0;
    sprintf(pcVar13,"%dkey",pfVar10);
    pfVar21 = pfStack_16d0;
    auStack_16b0._0_8_ = 0x6363636363636363;
    auStack_16b0._8_8_ = (fdb_custom_cmp_variable)0x6363636363636363;
    auStack_16b0._16_8_ = (void *)0x6363636363636363;
    auStack_16b0._24_8_ = (kvs_info *)0x6363636363636363;
    auStack_16b0._32_8_ = (kvs_ops_stat *)0x6363636363636363;
    auStack_16b0._40_8_ = (fdb_file_handle *)0x6363636363636363;
    auStack_16b0._48_8_ = (hbtrie *)0x6363636363636363;
    auStack_16b0._56_8_ = (btree *)0x6363636363636363;
    auStack_16b0._64_8_ = (btree *)0x6363636363636363;
    auStack_16b0._72_8_ = (filemgr *)0x6363636363636363;
    auStack_16b0._80_8_ = (docio_handle *)0x6363636363636363;
    auStack_16b0._88_8_ = (btreeblk_handle *)0x6363636363636363;
    auStack_16b0._96_8_ = (btree_blk_ops *)0x6363636363636363;
    auStack_16b0._104_7_ = 0x63636363636363;
    auStack_16b0[0x6f] = 99;
    auStack_16b0._112_7_ = 0x63636363636363;
    auStack_16b0._119_8_ = 0x6363636363636363;
    auStack_16b0[0x7f] = 0;
    pfStack_16d8 = (fdb_kvs_handle *)0x10dc39;
    pcVar7 = (char *)strlen(pcVar13);
    pfStack_16d8 = (fdb_kvs_handle *)0x10dc44;
    sVar6 = strlen((char *)pfVar12);
    pfStack_16d8 = (fdb_kvs_handle *)0x10dc58;
    fVar2 = fdb_set_kv(pfVar21,pcVar13,(size_t)pcVar7,pfVar12,sVar6);
    pcVar23 = (char *)pfVar10;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010de47;
    pfStack_16d8 = (fdb_kvs_handle *)0x10dc6d;
    fVar2 = fdb_get_file_info(pfStack_16c8,(fdb_file_info *)pfVar11);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010de40;
    uVar17 = (uint)pfVar10 + 1;
    pcVar23 = (char *)(ulong)uVar17;
  } while ((ulong)auStack_1498._40_8_ < (fdb_file_handle *)0x1000000);
  pfStack_16d8 = (fdb_kvs_handle *)0x10dc92;
  sVar3 = sb_check_block_reusing(pfStack_16d0);
  if (sVar3 == SBD_NONE) {
    pfStack_16d8 = (fdb_kvs_handle *)0x10dca9;
    fVar2 = fdb_commit(pfStack_16c8,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010de61;
    pcVar7 = "%dkey";
    pcVar13 = auStack_1498 + 0x48;
    pfVar21 = (fdb_kvs_handle *)0x0;
    do {
      pfStack_16d8 = (fdb_kvs_handle *)0x10dcd5;
      sprintf(pcVar13,"%dkey",pfVar21);
      pfVar12 = pfStack_16d0;
      pfStack_16d8 = (fdb_kvs_handle *)0x10dce1;
      sVar6 = strlen(pcVar13);
      pfStack_16d8 = (fdb_kvs_handle *)0x10dcef;
      fVar2 = fdb_del_kv(pfVar12,pcVar13,sVar6);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010de4e;
      uVar22 = (int)pfVar21 + 1;
      pfVar21 = (fdb_kvs_handle *)(ulong)uVar22;
    } while (uVar17 != uVar22);
    pfStack_16d8 = (fdb_kvs_handle *)0x10dd06;
    sVar3 = sb_check_block_reusing(pfStack_16d0);
    if (sVar3 != SBD_RECLAIM) goto LAB_0010de68;
    if (2 < (uint)pfVar10) {
      pcVar23 = (char *)(ulong)(uVar17 >> 2);
      pcVar13 = auStack_1498 + 0x48;
      pfVar12 = (fdb_kvs_handle *)auStack_16b0;
      pfVar21 = (fdb_kvs_handle *)0x0;
      do {
        pfStack_16d8 = (fdb_kvs_handle *)0x10dd3e;
        sprintf(pcVar13,"%dkey",pfVar21);
        pfVar10 = pfStack_16d0;
        auStack_16b0._0_8_ = 0x6464646464646464;
        auStack_16b0._8_8_ = (fdb_custom_cmp_variable)0x6464646464646464;
        auStack_16b0._16_8_ = (void *)0x6464646464646464;
        auStack_16b0._24_8_ = (kvs_info *)0x6464646464646464;
        auStack_16b0._32_8_ = (kvs_ops_stat *)0x6464646464646464;
        auStack_16b0._40_8_ = (fdb_file_handle *)0x6464646464646464;
        auStack_16b0._48_8_ = (hbtrie *)0x6464646464646464;
        auStack_16b0._56_8_ = (btree *)0x6464646464646464;
        auStack_16b0._64_8_ = (btree *)0x6464646464646464;
        auStack_16b0._72_8_ = (filemgr *)0x6464646464646464;
        auStack_16b0._80_8_ = (docio_handle *)0x6464646464646464;
        auStack_16b0._88_8_ = (btreeblk_handle *)0x6464646464646464;
        auStack_16b0._96_8_ = (btree_blk_ops *)0x6464646464646464;
        auStack_16b0._104_7_ = 0x64646464646464;
        auStack_16b0[0x6f] = 100;
        auStack_16b0._112_7_ = 0x64646464646464;
        auStack_16b0._119_8_ = 0x6464646464646464;
        auStack_16b0[0x7f] = 0;
        pfStack_16d8 = (fdb_kvs_handle *)0x10dd87;
        pcVar7 = (char *)strlen(pcVar13);
        pfStack_16d8 = (fdb_kvs_handle *)0x10dd92;
        sVar6 = strlen((char *)pfVar12);
        pfStack_16d8 = (fdb_kvs_handle *)0x10dda6;
        fVar2 = fdb_set_kv(pfVar10,pcVar13,(size_t)pcVar7,pfVar12,sVar6);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010de55;
        uVar22 = (int)pfVar21 + 2;
        pfVar21 = (fdb_kvs_handle *)(ulong)uVar22;
      } while (uVar22 < uVar17 >> 2);
    }
    pcVar13 = auStack_1498 + 0x48;
    pfStack_16d8 = (fdb_kvs_handle *)0x10ddc2;
    sVar3 = sb_check_block_reusing(pfStack_16d0);
    if (sVar3 != SBD_RECLAIM) goto LAB_0010de6d;
    pfStack_16d8 = (fdb_kvs_handle *)0x10ddd5;
    fVar2 = fdb_close(pfStack_16c8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010de72;
    pfStack_16d8 = (fdb_kvs_handle *)0x10dde2;
    fVar2 = fdb_shutdown();
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pfStack_16d8 = (fdb_kvs_handle *)0x10ddef;
      memleak_end();
      pcVar13 = "%s PASSED\n";
      if (reuse_on_delete_test()::__test_pass != '\0') {
        pcVar13 = "%s FAILED\n";
      }
      pfStack_16d8 = (fdb_kvs_handle *)0x10de20;
      fprintf(_stderr,pcVar13,"reuse on delete test");
      return;
    }
  }
  else {
LAB_0010de5c:
    pfStack_16d8 = (fdb_kvs_handle *)0x10de61;
    reuse_on_delete_test();
LAB_0010de61:
    pfVar10 = pfVar11;
    pfStack_16d8 = (fdb_kvs_handle *)0x10de68;
    reuse_on_delete_test();
LAB_0010de68:
    pfStack_16d8 = (fdb_kvs_handle *)0x10de6d;
    reuse_on_delete_test();
LAB_0010de6d:
    pfStack_16d8 = (fdb_kvs_handle *)0x10de72;
    reuse_on_delete_test();
LAB_0010de72:
    pfStack_16d8 = (fdb_kvs_handle *)0x10de79;
    reuse_on_delete_test();
  }
  pfStack_16d8 = (fdb_kvs_handle *)fragmented_reuse_test;
  reuse_on_delete_test();
  pfStack_1bc0 = (fdb_kvs_handle *)0x10de9d;
  fStack_18f8.bub_ctx.space_used = (uint64_t)pcVar23;
  fStack_18f8.bub_ctx.handle = pfVar12;
  pfStack_16f0 = pfVar10;
  pcStack_16e8 = pcVar7;
  pcStack_16e0 = pcVar13;
  pfStack_16d8 = pfVar21;
  gettimeofday(&tStack_1b68,(__timezone_ptr_t)0x0);
  pfStack_1bc0 = (fdb_kvs_handle *)0x10dea2;
  memleak_start();
  pfStack_1bc0 = (fdb_kvs_handle *)0x10deaf;
  fdb_get_default_kvs_config();
  pfStack_1bc0 = (fdb_kvs_handle *)0x10debf;
  fdb_get_default_config();
  fStack_18f8.config.block_reusing_threshold._7_1_ = 0;
  fStack_18f8.max_seqnum = 0x23;
  fStack_18f8.handle_busy.super___atomic_base<unsigned_char>._M_i =
       (__atomic_base<unsigned_char>)0xa;
  fStack_18f8.dirty_updates = '\0';
  fStack_18f8._466_6_ = 0;
  pfStack_1bc0 = (fdb_kvs_handle *)0x10dee6;
  system("rm -rf  staleblktest* > errorlog.txt");
  pfStack_1bc0 = (fdb_kvs_handle *)0x10defd;
  fdb_open(&pfStack_1ba8,"./staleblktest1",(fdb_config *)&fStack_18f8.config.encryption_key);
  pfStack_1bc0 = (fdb_kvs_handle *)0x10df0d;
  fdb_kvs_open_default(pfStack_1ba8,&pfStack_1bb0,&fStack_1b58);
  pcVar23 = "%dkey";
  pcVar13 = (char *)&fStack_18f8;
  pcVar7 = auStack_1b40 + 0x48;
  pfVar21 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_1bc0 = (fdb_kvs_handle *)0x10df35;
    sprintf(pcVar13,"%dkey",pfVar21);
    pfStack_1bc0 = (fdb_kvs_handle *)0x10df47;
    memset(pcVar7,0x61,0x1ff);
    pfVar11 = pfStack_1bb0;
    uStack_18f9 = 0;
    pfStack_1bc0 = (fdb_kvs_handle *)0x10df5c;
    pfVar12 = (fdb_kvs_handle *)strlen(pcVar13);
    pfStack_1bc0 = (fdb_kvs_handle *)0x10df67;
    sVar6 = strlen(pcVar7);
    pfStack_1bc0 = (fdb_kvs_handle *)0x10df7b;
    fVar2 = fdb_set_kv(pfVar11,pcVar13,(size_t)pfVar12,pcVar7,sVar6);
    if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0010e2e3:
      pfStack_1bc0 = (fdb_kvs_handle *)0x10e2ea;
      fragmented_reuse_test();
      goto LAB_0010e2ea;
    }
    pfStack_1bc0 = (fdb_kvs_handle *)0x10df92;
    fVar2 = fdb_commit(pfStack_1ba8,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pfStack_1bc0 = (fdb_kvs_handle *)0x10e2e3;
      fragmented_reuse_test();
      goto LAB_0010e2e3;
    }
    uVar17 = (int)pfVar21 + 1;
    pfVar21 = (fdb_kvs_handle *)(ulong)uVar17;
  } while (uVar17 != 0xb);
  pcVar7 = (char *)&fStack_18f8;
  pfVar11 = (fdb_kvs_handle *)(auStack_1b40 + 0x48);
  pfVar12 = (fdb_kvs_handle *)auStack_1b40;
  pcVar23 = (char *)0x0;
  do {
    uVar17 = (uint)pcVar23;
    pfStack_1bc0 = (fdb_kvs_handle *)0x10dfcb;
    sprintf(pcVar7,"%dkey",pcVar23);
    pfVar21 = pfStack_1bb0;
    auStack_1b40._72_8_ = (filemgr *)0x6262626262626262;
    pdStack_1af0 = (docio_handle *)0x6262626262626262;
    pbStack_1ae8 = (btreeblk_handle *)0x6262626262626262;
    pbStack_1ae0 = (btree_blk_ops *)0x6262626262626262;
    pfStack_1ad8 = (filemgr_ops *)0x6262626262626262;
    fStack_1ad0.chunksize = 0x6262;
    fStack_1ad0._2_2_ = 0x6262;
    fStack_1ad0.blocksize = 0x62626262;
    fStack_1ad0.buffercache_size = 0x6262626262626262;
    fStack_1ad0.wal_threshold = 0x6262626262626262;
    fStack_1ad0.wal_flush_before_commit = true;
    fStack_1ad0.auto_commit = true;
    fStack_1ad0._26_2_ = 0x6262;
    fStack_1ad0.purging_interval = 0x62626262;
    fStack_1ad0.seqtree_opt = 'b';
    fStack_1ad0.durability_opt = 'b';
    fStack_1ad0._34_2_ = 0x6262;
    fStack_1ad0.flags = 0x62626262;
    fStack_1ad0.compaction_buf_maxsize = 0x62626262;
    fStack_1ad0.cleanup_cache_onclose = true;
    fStack_1ad0.compress_document_body = true;
    fStack_1ad0.compaction_mode = 'b';
    fStack_1ad0.compaction_threshold = 'b';
    fStack_1ad0.compaction_minimum_filesize = 0x6262626262626262;
    fStack_1ad0.compactor_sleep_duration = 0x6262626262626262;
    fStack_1ad0.multi_kv_instances = true;
    fStack_1ad0._65_6_ = 0x626262626262;
    fStack_1ad0._71_1_ = 0x62;
    fStack_1ad0.prefetch_duration._0_7_ = 0x62626262626262;
    fStack_1ad0._79_8_ = 0x6262626262626262;
    fStack_1ad0._87_1_ = 0;
    pfStack_1bc0 = (fdb_kvs_handle *)0x10e027;
    pcVar13 = (char *)strlen(pcVar7);
    pfStack_1bc0 = (fdb_kvs_handle *)0x10e032;
    sVar6 = strlen((char *)pfVar11);
    pfStack_1bc0 = (fdb_kvs_handle *)0x10e046;
    fVar2 = fdb_set_kv(pfVar21,pcVar7,(size_t)pcVar13,pfVar11,sVar6);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e2f1;
    pfStack_1bc0 = (fdb_kvs_handle *)0x10e05b;
    fVar2 = fdb_get_file_info(pfStack_1ba8,(fdb_file_info *)pfVar12);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e2ea;
    uVar22 = uVar17 + 1;
    pcVar23 = (char *)(ulong)uVar22;
  } while ((ulong)auStack_1b40._40_8_ < (fdb_file_handle *)0x1000000);
  uStack_1b9c = uVar17;
  if (2 < uVar17) {
    uVar17 = (uVar22 >> 2) + (uint)(uVar22 >> 2 == 0);
    pfVar12 = (fdb_kvs_handle *)(ulong)uVar17;
    pcVar13 = "%dkey";
    pcVar7 = (char *)&fStack_18f8;
    pfVar21 = (fdb_kvs_handle *)0x0;
    do {
      pfStack_1bc0 = (fdb_kvs_handle *)0x10e0b2;
      sprintf(pcVar7,"%dkey",pfVar21);
      pfVar11 = pfStack_1bb0;
      pfStack_1bc0 = (fdb_kvs_handle *)0x10e0bf;
      sVar6 = strlen(pcVar7);
      pfStack_1bc0 = (fdb_kvs_handle *)0x10e0cd;
      fVar2 = fdb_del_kv(pfVar11,pcVar7,sVar6);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e2ff;
      uVar18 = (int)pfVar21 + 1;
      pfVar21 = (fdb_kvs_handle *)(ulong)uVar18;
    } while (uVar17 != uVar18);
  }
  pcVar7 = (char *)&fStack_18f8;
  pfStack_1bc0 = (fdb_kvs_handle *)0x10e0e6;
  sVar3 = sb_check_block_reusing(pfStack_1bb0);
  if (sVar3 == SBD_NONE) {
    pcVar7 = (char *)(pfStack_1bb0->file->pos).super___atomic_base<unsigned_long>._M_i;
    pfStack_1bc0 = (fdb_kvs_handle *)0x10e10c;
    fVar2 = fdb_compact(pfStack_1ba8,"staleblktest_compact");
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e319;
    pfStack_1bc0 = (fdb_kvs_handle *)0x10e123;
    fVar2 = fdb_get_kvs_info(pfStack_1bb0,&fStack_1b98);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e320;
    if (fStack_1b98.doc_count == 0) {
      pfStack_1bc0 = (fdb_kvs_handle *)0x10e13d;
      fragmented_reuse_test();
    }
    pcVar13 = (char *)(ulong)(uVar22 >> 2);
    if (pcVar7 <= (fdb_kvs_handle *)
                  (pfStack_1bb0->file->pos).super___atomic_base<unsigned_long>._M_i) {
      pfStack_1bc0 = (fdb_kvs_handle *)0x10e163;
      fragmented_reuse_test();
    }
    uVar17 = uVar22 >> 1;
    pfVar21 = (fdb_kvs_handle *)(ulong)uVar17;
    if (uVar22 >> 2 < uVar17) {
      pcVar7 = "%dkey";
      pfVar11 = &fStack_18f8;
      do {
        pfStack_1bc0 = (fdb_kvs_handle *)0x10e18b;
        sprintf((char *)pfVar11,"%dkey",pcVar13);
        pfVar12 = pfStack_1bb0;
        pfStack_1bc0 = (fdb_kvs_handle *)0x10e198;
        sVar6 = strlen((char *)pfVar11);
        pfStack_1bc0 = (fdb_kvs_handle *)0x10e1a6;
        fVar2 = fdb_del_kv(pfVar12,pfVar11,sVar6);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e306;
        uVar18 = (int)pcVar13 + 1;
        pcVar13 = (char *)(ulong)uVar18;
      } while (uVar18 < uVar17);
    }
    pfStack_1bc0 = (fdb_kvs_handle *)0x10e1c0;
    sVar3 = sb_check_block_reusing(pfStack_1bb0);
    if (sVar3 != SBD_NONE) goto LAB_0010e327;
    if (uVar17 <= uStack_1b9c) {
      pcVar13 = "%dkey";
      pcVar7 = (char *)&fStack_18f8;
      do {
        pfStack_1bc0 = (fdb_kvs_handle *)0x10e1ec;
        sprintf(pcVar7,"%dkey",pfVar21);
        pfVar11 = pfStack_1bb0;
        pfStack_1bc0 = (fdb_kvs_handle *)0x10e1f9;
        sVar6 = strlen(pcVar7);
        pfStack_1bc0 = (fdb_kvs_handle *)0x10e207;
        fVar2 = fdb_del_kv(pfVar11,pcVar7,sVar6);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e30d;
        uVar17 = (int)pfVar21 + 1;
        pfVar21 = (fdb_kvs_handle *)(ulong)uVar17;
      } while (uVar22 != uVar17);
    }
    pcVar23 = (char *)0xb;
    do {
      pfStack_1bc0 = (fdb_kvs_handle *)0x10e229;
      fVar2 = fdb_commit(pfStack_1ba8,'\x01');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e2f8;
      uVar17 = (int)pcVar23 - 1;
      pcVar23 = (char *)(ulong)uVar17;
    } while (uVar17 != 0);
    pfStack_1bc0 = (fdb_kvs_handle *)0x10e244;
    fVar2 = fdb_get_kvs_info(pfStack_1bb0,&fStack_1b98);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e32c;
    pfStack_1bc0 = (fdb_kvs_handle *)0x10e256;
    sVar3 = sb_check_block_reusing(pfStack_1bb0);
    if (sVar3 == SBD_NONE) goto LAB_0010e333;
    pfStack_1bc0 = (fdb_kvs_handle *)0x10e26d;
    fVar2 = fdb_commit(pfStack_1ba8,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e338;
    pfStack_1bc0 = (fdb_kvs_handle *)0x10e27f;
    fVar2 = fdb_close(pfStack_1ba8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e33f;
    pfStack_1bc0 = (fdb_kvs_handle *)0x10e28c;
    fVar2 = fdb_shutdown();
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pfStack_1bc0 = (fdb_kvs_handle *)0x10e299;
      memleak_end();
      pcVar13 = "%s PASSED\n";
      if (fragmented_reuse_test()::__test_pass != '\0') {
        pcVar13 = "%s FAILED\n";
      }
      pfStack_1bc0 = (fdb_kvs_handle *)0x10e2ca;
      fprintf(_stderr,pcVar13,"fragmented reuse test");
      return;
    }
  }
  else {
LAB_0010e314:
    pfStack_1bc0 = (fdb_kvs_handle *)0x10e319;
    fragmented_reuse_test();
LAB_0010e319:
    pfStack_1bc0 = (fdb_kvs_handle *)0x10e320;
    fragmented_reuse_test();
LAB_0010e320:
    pfStack_1bc0 = (fdb_kvs_handle *)0x10e327;
    fragmented_reuse_test();
LAB_0010e327:
    pfStack_1bc0 = (fdb_kvs_handle *)0x10e32c;
    fragmented_reuse_test();
LAB_0010e32c:
    pfStack_1bc0 = (fdb_kvs_handle *)0x10e333;
    fragmented_reuse_test();
LAB_0010e333:
    pfStack_1bc0 = (fdb_kvs_handle *)0x10e338;
    fragmented_reuse_test();
LAB_0010e338:
    pfStack_1bc0 = (fdb_kvs_handle *)0x10e33f;
    fragmented_reuse_test();
LAB_0010e33f:
    pfStack_1bc0 = (fdb_kvs_handle *)0x10e346;
    fragmented_reuse_test();
  }
  pfStack_1bc0 = (fdb_kvs_handle *)enter_reuse_via_separate_kvs_test;
  fragmented_reuse_test();
  pcStackY_2088 = (code *)0x10e36a;
  pcStack_1be8 = pcVar23;
  pfStack_1be0 = pfVar11;
  pfStack_1bd8 = pfVar12;
  pfStack_1bd0 = (fdb_kvs_handle *)pcVar13;
  pfStack_1bc8 = (fdb_kvs_handle *)pcVar7;
  pfStack_1bc0 = pfVar21;
  gettimeofday(&tStack_2050,(__timezone_ptr_t)0x0);
  pcStackY_2088 = (code *)0x10e36f;
  memleak_start();
  pfStack_2060 = (fdb_doc *)0x0;
  pcStackY_2088 = (code *)0x10e388;
  fdb_get_default_kvs_config();
  pcStackY_2088 = (code *)0x10e398;
  fdb_get_default_config();
  fStack_1ce0.compaction_threshold = '\0';
  fStack_1ce0.block_reusing_threshold = 0x23;
  fStack_1ce0.num_keeping_headers = 10;
  pcStackY_2088 = (code *)0x10e3bf;
  system("rm -rf  staleblktest* > errorlog.txt");
  pcStackY_2088 = (code *)0x10e3d6;
  fdb_open(&pfStack_2070,"./staleblktest1",&fStack_1ce0);
  pcStackY_2088 = (code *)0x10e3ed;
  fdb_kvs_open(pfStack_2070,&pfStack_2078,"db",&fStack_1e40);
  pcStackY_2088 = (code *)0x10e404;
  fdb_kvs_open(pfStack_2070,&pfStack_2058,"db2",&fStack_1e40);
  pcVar13 = acStack_1de0;
  doc = (fdb_doc **)0x6161616161616161;
  pcVar7 = acStack_2040;
  pcVar23 = (char *)0x0;
  do {
    pcStackY_2088 = (code *)0x10e430;
    sprintf(pcVar13,"%dkey",pcVar23);
    pfVar21 = pfStack_2078;
    builtin_strncpy(acStack_2040,"aaaaaaaaaaa",0xc);
    pcStackY_2088 = (code *)0x10e44f;
    sVar9 = strlen(pcVar13);
    pcStackY_2088 = (code *)0x10e45a;
    sVar6 = strlen(pcVar7);
    pcStackY_2088 = (code *)0x10e46e;
    fVar2 = fdb_set_kv(pfVar21,pcVar13,sVar9,pcVar7,sVar6);
    pfVar21 = pfStack_2058;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pcStackY_2088 = (code *)0x10e779;
      enter_reuse_via_separate_kvs_test();
LAB_0010e779:
      pcStackY_2088 = (code *)0x10e780;
      enter_reuse_via_separate_kvs_test();
LAB_0010e780:
      pcStackY_2088 = (code *)0x10e787;
      enter_reuse_via_separate_kvs_test();
      goto LAB_0010e787;
    }
    pcStackY_2088 = (code *)0x10e483;
    sVar9 = strlen(pcVar13);
    pcStackY_2088 = (code *)0x10e48e;
    sVar6 = strlen(pcVar7);
    pcStackY_2088 = (code *)0x10e4a2;
    fVar2 = fdb_set_kv(pfVar21,pcVar13,sVar9,pcVar7,sVar6);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e779;
    pcStackY_2088 = (code *)0x10e4b9;
    fVar2 = fdb_commit(pfStack_2070,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e780;
    uVar17 = (int)pcVar23 + 1;
    pcVar23 = (char *)(ulong)uVar17;
  } while (uVar17 != 10);
  pcVar7 = (char *)0x0;
  pcVar23 = acStack_1de0;
  pcVar13 = acStack_2040;
  doc = (fdb_doc **)0x0;
  do {
    pfVar21 = pfStack_2078;
    builtin_strncpy(acStack_1de0,"0key",5);
    builtin_strncpy(acStack_2040,
                    "bbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbb"
                    ,0x80);
    pcStackY_2088 = (code *)0x10e541;
    sVar9 = strlen(pcVar23);
    pcStackY_2088 = (code *)0x10e54c;
    sVar6 = strlen(pcVar13);
    pcStackY_2088 = (code *)0x10e560;
    fVar2 = fdb_set_kv(pfVar21,pcVar23,sVar9,pcVar13,sVar6);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e78e;
    pcStackY_2088 = (code *)0x10e57a;
    fVar2 = fdb_get_file_info(pfStack_2070,&fStack_1e28);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e787;
    uVar17 = (int)doc + 1;
    doc = (fdb_doc **)(ulong)uVar17;
  } while (fStack_1e28.file_size < 0x1000000);
  pcStackY_2088 = (code *)0x10e5a0;
  sVar3 = sb_check_block_reusing(pfStack_2078);
  if (sVar3 == SBD_RECLAIM) {
    pcStackY_2088 = (code *)0x10e5b8;
    fVar2 = fdb_commit(pfStack_2070,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e7a6;
    pcVar13 = acStack_1de0;
    pcVar7 = acStack_2040;
    pcVar23 = (char *)0x0;
    do {
      pcStackY_2088 = (code *)0x10e5e2;
      sprintf(pcVar13,"key%d",pcVar23);
      pfVar21 = pfStack_2078;
      builtin_strncpy(acStack_2040,
                      "ccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccc"
                      ,0x80);
      pcStackY_2088 = (code *)0x10e632;
      sVar9 = strlen(pcVar13);
      pcStackY_2088 = (code *)0x10e63d;
      sVar6 = strlen(pcVar7);
      pcStackY_2088 = (code *)0x10e651;
      fVar2 = fdb_set_kv(pfVar21,pcVar13,sVar9,pcVar7,sVar6);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e795;
      uVar22 = (int)pcVar23 + 1;
      pcVar23 = (char *)(ulong)uVar22;
    } while (uVar17 != uVar22);
    pcStackY_2088 = (code *)0x10e672;
    fVar2 = fdb_commit(pfStack_2070,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e7ad;
    pcStackY_2088 = (code *)0x10e69a;
    fdb_iterator_init(pfStack_2058,&pfStack_2068,(void *)0x0,0,(void *)0x0,0,0);
    pcVar23 = (char *)0xa;
    doc = &pfStack_2060;
    do {
      pcStackY_2088 = (code *)0x10e6b1;
      fVar2 = fdb_iterator_get(pfStack_2068,doc);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e79c;
      pcStackY_2088 = (code *)0x10e6c3;
      fdb_doc_free(pfStack_2060);
      pfStack_2060 = (fdb_doc *)0x0;
      pcStackY_2088 = (code *)0x10e6d6;
      fVar2 = fdb_iterator_next(pfStack_2068);
      uVar17 = (int)pcVar23 - 1;
      pcVar23 = (char *)(ulong)uVar17;
    } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
    if (uVar17 != 0) goto LAB_0010e7b4;
    pcStackY_2088 = (code *)0x10e6ef;
    fdb_iterator_close(pfStack_2068);
    pcStackY_2088 = (code *)0x10e6f9;
    fVar2 = fdb_kvs_close(pfStack_2078);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e7b9;
    pcStackY_2088 = (code *)0x10e70b;
    fVar2 = fdb_kvs_close(pfStack_2058);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pcStackY_2088 = (code *)0x10e71d;
      fVar2 = fdb_close(pfStack_2070);
      if (fVar2 == FDB_RESULT_SUCCESS) {
        pcStackY_2088 = (code *)0x10e72a;
        fdb_shutdown();
        pcStackY_2088 = (code *)0x10e72f;
        memleak_end();
        pcVar13 = "%s PASSED\n";
        if (enter_reuse_via_separate_kvs_test()::__test_pass != '\0') {
          pcVar13 = "%s FAILED\n";
        }
        pcStackY_2088 = (code *)0x10e760;
        fprintf(_stderr,pcVar13,"enter reuse via separate kvs test");
        return;
      }
      goto LAB_0010e7c7;
    }
  }
  else {
LAB_0010e7a1:
    pcStackY_2088 = (code *)0x10e7a6;
    enter_reuse_via_separate_kvs_test();
LAB_0010e7a6:
    pcStackY_2088 = (code *)0x10e7ad;
    enter_reuse_via_separate_kvs_test();
LAB_0010e7ad:
    pcStackY_2088 = (code *)0x10e7b4;
    enter_reuse_via_separate_kvs_test();
LAB_0010e7b4:
    pcStackY_2088 = (code *)0x10e7b9;
    enter_reuse_via_separate_kvs_test();
LAB_0010e7b9:
    pcStackY_2088 = (code *)0x10e7c0;
    enter_reuse_via_separate_kvs_test();
  }
  pcStackY_2088 = (code *)0x10e7c7;
  enter_reuse_via_separate_kvs_test();
LAB_0010e7c7:
  pcStackY_2088 = child_function;
  enter_reuse_via_separate_kvs_test();
  ppfStackY_20b0 = doc;
  sStackY_20a0 = sVar9;
  pcStackY_2098 = pcVar13;
  pcStackY_2090 = pcVar7;
  pcStackY_2088 = (code *)pcVar23;
  fdb_get_default_kvs_config();
  fdb_get_default_config();
  fStackY_23b0.block_reusing_threshold = 0x41;
  fStackY_23b0.num_keeping_headers = 5;
  fdb_open(&pfStackY_24d8,"./staleblktest1",&fStackY_23b0);
  fdb_kvs_open(pfStackY_24d8,&pfStackY_24e0,"db",&fStackY_24d0);
  iVar4 = 0;
  uVar19 = 0;
  do {
    sprintf(acStackY_24b8,"key%d",uVar19);
    sprintf(acStackY_22b8,"seqno%d",uVar19);
    pfVar21 = pfStackY_24e0;
    sVar6 = strlen(acStackY_24b8);
    sVar9 = strlen(acStackY_22b8);
    fdb_set_kv(pfVar21,acStackY_24b8,sVar6,acStackY_22b8,sVar9);
    if ((int)(uVar19 / 100) * 100 + iVar4 == 0) {
      fdb_commit(pfStackY_24d8,(int)(uVar19 / 500) * 500 + iVar4 == 0);
    }
    uVar19 = (ulong)((int)uVar19 + 1);
    iVar4 = iVar4 + -1;
  } while( true );
LAB_0010ca07:
  pcStack_388 = (code *)0x10ca0e;
  snapshot_inmem_before_block_reuse_test();
LAB_0010ca0e:
  pcStack_388 = (code *)0x10ca15;
  snapshot_inmem_before_block_reuse_test();
LAB_0010ca15:
  pcStack_388 = (code *)0x10ca1c;
  snapshot_inmem_before_block_reuse_test();
LAB_0010ca1c:
  unaff_R14 = "val";
  pfVar14 = (fdb_config *)0x148599;
  pcStack_388 = (code *)0x10ca23;
  snapshot_inmem_before_block_reuse_test();
  goto LAB_0010ca23;
code_r0x0010cc8c:
  unaff_RBP = unaff_RBP + 0x400;
  if (unaff_RBP == 0xfff) goto code_r0x0010cc9c;
  goto LAB_0010cc33;
code_r0x0010cc9c:
  pcStack_670 = (code *)0x10ccab;
  fVar2 = fdb_get_file_info(pfStack_660,&fStack_5f0);
  aVar24 = aStack_650;
  sVar20 = sStack_658;
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d08a;
  handle.seqtree = (btree *)&(aStack_650.seqtree)->vsize;
  sVar8 = (size_t)((int)sStack_658 + 8);
  if (0xffffff < fStack_5f0.file_size) goto code_r0x0010ccd6;
  goto LAB_0010cc24;
LAB_0010d08a:
  pcStack_670 = (code *)0x10d091;
  variable_value_size_test();
LAB_0010d091:
  pcStack_670 = (code *)0x10d098;
  variable_value_size_test();
  aVar25 = handle;
LAB_0010d098:
  handle = aVar25;
  pcStack_670 = (code *)0x10d09f;
  variable_value_size_test();
LAB_0010d09f:
  pcStack_670 = (code *)0x10d0a6;
  variable_value_size_test();
  sVar20 = unaff_RBP;
  aVar24 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar23;
  goto LAB_0010d0a6;
code_r0x0010ccd6:
  pcStack_670 = (code *)0x10ccdf;
  sVar3 = sb_check_block_reusing((fdb_kvs_handle *)aStack_668.seqtree);
  if (sVar3 != SBD_RECLAIM) goto LAB_0010d0ad;
  pcStack_670 = (code *)0x10ccf4;
  fVar2 = fdb_commit(pfStack_660,'\0');
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d0b2;
  pcStack_670 = (code *)0x10cd11;
  fVar2 = fdb_snapshot_open((fdb_kvs_handle *)aStack_668.seqtree,
                            (fdb_kvs_handle **)&aStack_638.seqtree,0xffffffffffffffff);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d0b9;
  if ((fdb_kvs_handle *)aVar24.seqtree != (fdb_kvs_handle *)0x0) {
    aStack_628.seqtree = aVar24.seqtree;
    pcVar13 = (char *)0x0;
    aStack_620 = handle;
    do {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = aVar24;
      uVar17 = (int)sVar20 + 1;
      pcStack_670 = (code *)0x10cd63;
      sprintf((char *)&fStack_5a8,"%d_key",(ulong)uVar17);
      sStack_658 = sVar20;
      aStack_650 = aVar24;
      if ((int)uVar17 < 2) {
        uVar19 = 0;
      }
      else {
        uVar19 = sVar20 & 0xffffffff;
        pcStack_670 = (code *)0x10cd85;
        memset(pcVar7,99,uVar19);
      }
      pcVar23 = (char *)aStack_668;
      pcVar7[uVar19] = '\0';
      pfVar14 = &fStack_5a8;
      pcStack_670 = (code *)0x10cda1;
      sVar6 = strlen((char *)pfVar14);
      unaff_RBP = sVar6 + 1;
      pcStack_670 = (code *)0x10cdad;
      sVar6 = strlen(pcVar7);
      pcStack_670 = (code *)0x10cdc2;
      fVar2 = fdb_set_kv((fdb_kvs_handle *)pcVar23,pfVar14,unaff_RBP,pcVar7,sVar6 + 1);
      handle = aStack_620;
      aVar25 = SUB168(auVar1 * ZEXT816(0xcccccccccccccccd),8);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d098;
      if ((fdb_kvs_handle *)
          (&((fdb_kvs_config *)&(aStack_620.seqtree)->ksize)->create_if_missing +
          ~(((ulong)aVar24.seqtree / 5 & 0xfffffffffffffffe) * 5)) == (fdb_kvs_handle *)pcVar13) {
        pcStack_670 = (code *)0x10cdfc;
        fVar2 = fdb_commit(pfStack_660,'\x01');
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d09f;
      }
      aVar24.seqtree = (btree *)((long)&aStack_650.seqtree[-1].aux + 7);
      pcVar13 = (char *)&((btree *)pcVar13)->vsize;
      sVar20 = (size_t)((int)sStack_658 - 8);
    } while (aStack_628.seqtree != (btree *)pcVar13);
  }
  pfVar14 = &fStack_5a8;
  pcStack_670 = (code *)0x10ce31;
  fVar2 = fdb_commit(pfStack_660,'\x01');
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d0c0;
  aVar24.seqtree = (btree *)&fStack_5a8;
  pcStack_670 = (code *)0x10ce57;
  sprintf((char *)aVar24.seqtree,"%d_key",0x200);
  pcStack_670 = (code *)0x10ce69;
  memset(pcVar7,0x61,0x4fffff);
  pcVar13 = (char *)aStack_668;
  pcVar7[0x4fffff] = '\0';
  pcStack_670 = (code *)0x10ce7c;
  sVar6 = strlen((char *)aVar24.seqtree);
  pfVar14 = (fdb_config *)(sVar6 + 1);
  pcStack_670 = (code *)0x10ce88;
  sVar6 = strlen(pcVar7);
  pcStack_670 = (code *)0x10ce9d;
  fVar2 = fdb_set_kv((fdb_kvs_handle *)pcVar13,aVar24.seqtree,(size_t)pfVar14,pcVar7,sVar6 + 1);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d0c7;
  pcStack_670 = (code *)0x10ceb4;
  fVar2 = fdb_commit(pfStack_660,'\x01');
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d0ce;
  pcStack_670 = (code *)0x10ceda;
  sprintf((char *)&fStack_5a8,"%d_key",0x200);
  pcStack_670 = (code *)0x10ceec;
  memset(pcVar7,0x61,0x1ff);
  pcVar13 = (char *)aStack_630;
  pcVar7[0x1ff] = '\0';
  pcStack_670 = (code *)0x10cf00;
  sVar6 = strlen((char *)&fStack_5a8);
  pcStack_670 = (code *)0x10cf19;
  fVar2 = fdb_get_kv((fdb_kvs_handle *)pcVar13,(btree *)&fStack_5a8,sVar6 + 1,&aStack_640.seqtree,
                     (size_t *)&pkStack_648);
  aVar25 = aStack_640;
  aVar24.seqtree = (btree *)&fStack_5a8;
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d0d5;
  pcStack_670 = (code *)0x10cf36;
  iVar4 = bcmp(pcVar7,aStack_640.seqtree,(size_t)pkStack_648);
  if (iVar4 != 0) goto LAB_0010d0dc;
  pcStack_670 = (code *)0x10cf46;
  fVar2 = fdb_free_block(aVar25.seqtree);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d0e4;
  aVar25.seqtree = (btree *)&fStack_5a8;
  pcStack_670 = (code *)0x10cf6c;
  sprintf((char *)aVar25.seqtree,"%d_key",0x800);
  pcStack_670 = (code *)0x10cf7e;
  memset(pcVar7,0x62,0x7ff);
  pcVar13 = (char *)aStack_638;
  pcVar7[0x7ff] = '\0';
  pcStack_670 = (code *)0x10cf92;
  sVar6 = strlen((char *)aVar25.seqtree);
  pcStack_670 = (code *)0x10cfab;
  fVar2 = fdb_get_kv((fdb_kvs_handle *)pcVar13,aVar25.seqtree,sVar6 + 1,&aStack_640.seqtree,
                     (size_t *)&pkStack_648);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d0eb;
  pcStack_670 = (code *)0x10cfc8;
  iVar4 = bcmp(pcVar7,aStack_640.seqtree,(size_t)pkStack_648);
  aVar25 = aStack_640;
  if (iVar4 != 0) goto LAB_0010d0f2;
  pcStack_670 = (code *)0x10cfd8;
  fVar2 = fdb_free_block(aStack_640.seqtree);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d0fa;
  pcStack_670 = (code *)0x10cfe8;
  operator_delete__(pcVar7);
  pcStack_670 = (code *)0x10cff1;
  fVar2 = fdb_kvs_close((fdb_kvs_handle *)aStack_668.seqtree);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d101;
  pcStack_670 = (code *)0x10d003;
  fVar2 = fdb_kvs_close((fdb_kvs_handle *)aStack_630.seqtree);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d108;
  pcStack_670 = (code *)0x10d015;
  fVar2 = fdb_kvs_close((fdb_kvs_handle *)aStack_638.seqtree);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d10f;
  pcStack_670 = (code *)0x10d027;
  fVar2 = fdb_close(pfStack_660);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcStack_670 = (code *)0x10d034;
    fdb_shutdown();
    pcStack_670 = (code *)0x10d039;
    memleak_end();
    pcVar13 = "%s PASSED\n";
    if (variable_value_size_test()::__test_pass != '\0') {
      pcVar13 = "%s FAILED\n";
    }
    pcStack_670 = (code *)0x10d06a;
    fprintf(_stderr,pcVar13,"variable value size test");
    return;
  }
  goto LAB_0010d116;
LAB_0010d46c:
  pcStack_d48 = (code *)0x10d473;
  rollback_with_num_keeping_headers();
LAB_0010d473:
  pcStack_d48 = (code *)0x10d47a;
  rollback_with_num_keeping_headers();
LAB_0010d47a:
  pcStack_d48 = (code *)0x10d481;
  rollback_with_num_keeping_headers();
  goto LAB_0010d481;
LAB_0010da0f:
  pcStack_1230 = (code *)0x10da16;
  crash_and_recover_with_num_keeping_test();
LAB_0010da16:
  pcStack_1230 = (code *)0x10da1d;
  crash_and_recover_with_num_keeping_test();
LAB_0010da1d:
  pcStack_1230 = (code *)0x10da24;
  crash_and_recover_with_num_keeping_test();
LAB_0010da24:
  pcStack_1230 = (code *)0x10da2b;
  crash_and_recover_with_num_keeping_test();
LAB_0010da2b:
  pcStack_1230 = (code *)0x10da32;
  crash_and_recover_with_num_keeping_test();
LAB_0010da32:
  pcStack_1230 = (code *)0x10da39;
  crash_and_recover_with_num_keeping_test();
LAB_0010da39:
  pcStack_1230 = (code *)0x10da40;
  crash_and_recover_with_num_keeping_test();
  goto LAB_0010da40;
LAB_0010de40:
  pfStack_16d8 = (fdb_kvs_handle *)0x10de47;
  reuse_on_delete_test();
LAB_0010de47:
  pfVar10 = pfVar11;
  pfStack_16d8 = (fdb_kvs_handle *)0x10de4e;
  reuse_on_delete_test();
LAB_0010de4e:
  pfStack_16d8 = (fdb_kvs_handle *)0x10de55;
  reuse_on_delete_test();
LAB_0010de55:
  pfStack_16d8 = (fdb_kvs_handle *)0x10de5c;
  reuse_on_delete_test();
  pfVar11 = pfVar10;
  goto LAB_0010de5c;
LAB_0010e2ea:
  pfStack_1bc0 = (fdb_kvs_handle *)0x10e2f1;
  fragmented_reuse_test();
LAB_0010e2f1:
  pfStack_1bc0 = (fdb_kvs_handle *)0x10e2f8;
  fragmented_reuse_test();
LAB_0010e2f8:
  pfStack_1bc0 = (fdb_kvs_handle *)0x10e2ff;
  fragmented_reuse_test();
LAB_0010e2ff:
  pfStack_1bc0 = (fdb_kvs_handle *)0x10e306;
  fragmented_reuse_test();
LAB_0010e306:
  pfStack_1bc0 = (fdb_kvs_handle *)0x10e30d;
  fragmented_reuse_test();
LAB_0010e30d:
  pfStack_1bc0 = (fdb_kvs_handle *)0x10e314;
  fragmented_reuse_test();
  goto LAB_0010e314;
LAB_0010e787:
  pcStackY_2088 = (code *)0x10e78e;
  enter_reuse_via_separate_kvs_test();
LAB_0010e78e:
  pcStackY_2088 = (code *)0x10e795;
  enter_reuse_via_separate_kvs_test();
LAB_0010e795:
  pcStackY_2088 = (code *)0x10e79c;
  enter_reuse_via_separate_kvs_test();
LAB_0010e79c:
  pcStackY_2088 = (code *)0x10e7a1;
  enter_reuse_via_separate_kvs_test();
  goto LAB_0010e7a1;
}

Assistant:

void snapshot_after_block_reuse_test() {
    memleak_start();
    TEST_INIT();

    int i, r;
    int low_seq = 0;
    int nheaders=5;
    char keybuf[16];

    fdb_file_handle* dbfile;
    fdb_kvs_handle* db;
    fdb_kvs_handle* snap_db;
    fdb_status status;
    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fdb_file_info file_info;

    r = system(SHELL_DEL" staleblktest* > errorlog.txt");
    (void)r;

    // init
    fconfig.compaction_threshold = 0;
    fconfig.num_keeping_headers = nheaders;
    status = fdb_open(&dbfile, "./staleblktest1", &fconfig);
    TEST_STATUS(status);
    status = fdb_kvs_open(dbfile, &db, "num_keep", &kvs_config);
    TEST_STATUS(status);

    const char *key = "key";
    const char *val = "val";

    // load until exceeding SB_MIN_BLOCK_REUSING_FILESIZE
    i = 0;
    do {
        status = fdb_set_kv(db, key, strlen(key) + 1, val, strlen(val) + 1);
        TEST_STATUS(status);
        i++;
        status = fdb_get_file_info(dbfile, &file_info);
        TEST_STATUS(status);
    } while (file_info.file_size <= SB_MIN_BLOCK_REUSING_FILESIZE);

    // create lowest commit
    status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_STATUS(status);
    low_seq = i;

    // create nheaders
    for (i = 0; i < nheaders + 5; ++i) {
        sprintf(keybuf, "key%d", i);
        status = fdb_set_kv(db, keybuf, strlen(keybuf), (char *)"reu", 4);
        TEST_STATUS(status);
        status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
        TEST_STATUS(status);
    }

    // make sure all blocks up to kept headers are reused
    i = low_seq;
    while (--i) {
        status = fdb_set_kv(db, key, strlen(key) + 1, val, strlen(val) + 1);
        TEST_STATUS(status);
    }
    status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_STATUS(status);

    // open snapshot on lowest seqno available
    low_seq += 6;
    status = fdb_snapshot_open(db, &snap_db, low_seq);
    TEST_STATUS(status);
    status = fdb_kvs_close(snap_db);
    TEST_STATUS(status);

    // open snapshot using seqno already reclaimed
    status = fdb_snapshot_open(db, &snap_db, low_seq-1);
    TEST_CHK(status == FDB_RESULT_NO_DB_INSTANCE);

    status = fdb_kvs_close(db);
    TEST_STATUS(status);
    status = fdb_close(dbfile);
    TEST_STATUS(status);
    fdb_shutdown();

    memleak_end();
    TEST_RESULT("snapshot after block reuse test");
}